

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cc
# Opt level: O1

t_object * xemmai::t_symbol::f_instantiate(wstring_view a_value)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int iVar2;
  const_iterator __pos;
  t_object *ptVar3;
  wchar_t *in_RSI;
  _Base_ptr in_RDI;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *__const_this;
  long in_FS_OFFSET;
  iterator i;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
  local_48;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_40;
  void *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x60);
  local_40._M_len = (size_t)in_RDI;
  local_40._M_str = in_RSI;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x470));
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  __mutex = (pthread_mutex_t *)(lVar1 + 0x170);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  __pos = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
          ::_M_lower_bound_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                      *)(lVar1 + 0x440),&local_40);
  local_48._M_node = __pos._M_node;
  if ((__pos._M_node == (_Base_ptr)(lVar1 + 0x448)) ||
     ((_Base_ptr)local_40._M_len != __pos._M_node[1]._M_parent)) {
LAB_00132f19:
    local_30 = (void *)0x0;
    local_48._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
         ::
         _M_emplace_hint_unique<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&,decltype(nullptr)>
                   ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                     *)(lVar1 + 0x440),__pos,&local_40,&local_30);
    pthread_mutex_unlock(__mutex);
    ptVar3 = t_type_of<xemmai::t_object>::
             f_new<xemmai::t_symbol,std::_Rb_tree_iterator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>&>
                       (*(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x98),
                        &local_48);
  }
  else {
    if ((_Base_ptr)local_40._M_len != (_Base_ptr)0x0) {
      iVar2 = wmemcmp(local_40._M_str,*(wchar_t **)(__pos._M_node + 1),local_40._M_len);
      if (iVar2 != 0) goto LAB_00132f19;
    }
    *(undefined1 *)(*(long *)(__pos._M_node + 2) + 0x19) = 1;
    pthread_mutex_unlock(__mutex);
    ptVar3 = *(t_object **)(local_48._M_node + 2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x470));
  return ptVar3;
}

Assistant:

t_object* t_symbol::f_instantiate(std::wstring_view a_value)
{
	auto engine = f_engine();
	std::lock_guard lock(engine->v_symbol__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	auto& instances = engine->v_symbol__instances;
	auto i = instances.lower_bound(a_value);
	if (i == instances.end() || i->first != a_value) {
		i = instances.emplace_hint(i, a_value, nullptr);
		engine->v_object__reviving__mutex.unlock();
		return f_new<t_symbol>(f_global(), i);
	} else {
		i->second->v_reviving = true;
		engine->v_object__reviving__mutex.unlock();
		return i->second;
	}
}